

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cryptor.cpp
# Opt level: O0

unique_ptr<Cryptor,_std::default_delete<Cryptor>_> __thiscall
Cryptor::cryptor_factory(Cryptor *this,bool mode,Cryptors type,string *message)

{
  runtime_error *this_00;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  undefined1 local_30 [16];
  undefined1 local_20 [8];
  string *message_local;
  Cryptors type_local;
  bool mode_local;
  
  local_20 = (undefined1  [8])message;
  message_local._0_4_ = type;
  message_local._7_1_ = mode;
  _type_local = this;
  if ((mode) && (type == Huffman)) {
    std::make_unique<HuffmanEncoder,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_30 + 8));
    std::unique_ptr<Cryptor,std::default_delete<Cryptor>>::
    unique_ptr<HuffmanEncoder,std::default_delete<HuffmanEncoder>,void>
              ((unique_ptr<Cryptor,std::default_delete<Cryptor>> *)this,
               (unique_ptr<HuffmanEncoder,_std::default_delete<HuffmanEncoder>_> *)(local_30 + 8));
    std::unique_ptr<HuffmanEncoder,_std::default_delete<HuffmanEncoder>_>::~unique_ptr
              ((unique_ptr<HuffmanEncoder,_std::default_delete<HuffmanEncoder>_> *)(local_30 + 8));
  }
  else if ((mode) || (type != Huffman)) {
    if ((mode) && (type == Lz77)) {
      std::make_unique<Lz77Encoder,std::__cxx11::string_const&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_40 + 8)
                );
      std::unique_ptr<Cryptor,std::default_delete<Cryptor>>::
      unique_ptr<Lz77Encoder,std::default_delete<Lz77Encoder>,void>
                ((unique_ptr<Cryptor,std::default_delete<Cryptor>> *)this,
                 (unique_ptr<Lz77Encoder,_std::default_delete<Lz77Encoder>_> *)(local_40 + 8));
      std::unique_ptr<Lz77Encoder,_std::default_delete<Lz77Encoder>_>::~unique_ptr
                ((unique_ptr<Lz77Encoder,_std::default_delete<Lz77Encoder>_> *)(local_40 + 8));
    }
    else if ((mode) || (type != Lz77)) {
      if ((mode) && (type == Deflate)) {
        std::make_unique<DeflateEncoder,std::__cxx11::string_const&>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_50 + 8));
        std::unique_ptr<Cryptor,std::default_delete<Cryptor>>::
        unique_ptr<DeflateEncoder,std::default_delete<DeflateEncoder>,void>
                  ((unique_ptr<Cryptor,std::default_delete<Cryptor>> *)this,
                   (unique_ptr<DeflateEncoder,_std::default_delete<DeflateEncoder>_> *)
                   (local_50 + 8));
        std::unique_ptr<DeflateEncoder,_std::default_delete<DeflateEncoder>_>::~unique_ptr
                  ((unique_ptr<DeflateEncoder,_std::default_delete<DeflateEncoder>_> *)
                   (local_50 + 8));
      }
      else {
        if ((mode) || (type != Deflate)) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"Not implemented factory case");
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::make_unique<DeflateDecoder,std::__cxx11::string_const&>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
        std::unique_ptr<Cryptor,std::default_delete<Cryptor>>::
        unique_ptr<DeflateDecoder,std::default_delete<DeflateDecoder>,void>
                  ((unique_ptr<Cryptor,std::default_delete<Cryptor>> *)this,
                   (unique_ptr<DeflateDecoder,_std::default_delete<DeflateDecoder>_> *)local_50);
        std::unique_ptr<DeflateDecoder,_std::default_delete<DeflateDecoder>_>::~unique_ptr
                  ((unique_ptr<DeflateDecoder,_std::default_delete<DeflateDecoder>_> *)local_50);
      }
    }
    else {
      std::make_unique<Lz77Decoder,std::__cxx11::string_const&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::unique_ptr<Cryptor,std::default_delete<Cryptor>>::
      unique_ptr<Lz77Decoder,std::default_delete<Lz77Decoder>,void>
                ((unique_ptr<Cryptor,std::default_delete<Cryptor>> *)this,
                 (unique_ptr<Lz77Decoder,_std::default_delete<Lz77Decoder>_> *)local_40);
      std::unique_ptr<Lz77Decoder,_std::default_delete<Lz77Decoder>_>::~unique_ptr
                ((unique_ptr<Lz77Decoder,_std::default_delete<Lz77Decoder>_> *)local_40);
    }
  }
  else {
    std::make_unique<HuffmanDecoder,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
    std::unique_ptr<Cryptor,std::default_delete<Cryptor>>::
    unique_ptr<HuffmanDecoder,std::default_delete<HuffmanDecoder>,void>
              ((unique_ptr<Cryptor,std::default_delete<Cryptor>> *)this,
               (unique_ptr<HuffmanDecoder,_std::default_delete<HuffmanDecoder>_> *)local_30);
    std::unique_ptr<HuffmanDecoder,_std::default_delete<HuffmanDecoder>_>::~unique_ptr
              ((unique_ptr<HuffmanDecoder,_std::default_delete<HuffmanDecoder>_> *)local_30);
  }
  return (__uniq_ptr_data<Cryptor,_std::default_delete<Cryptor>,_true,_true>)
         (__uniq_ptr_data<Cryptor,_std::default_delete<Cryptor>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Cryptor> Cryptor::cryptor_factory(
  const bool mode,
  const Cryptors type,
  const std::string& message
) {
  if (mode &&
    type == Cryptors::Huffman) {
    return std::unique_ptr<Cryptor>(std::make_unique<HuffmanEncoder>(message));
  }
  if (!mode &&
    type == Cryptors::Huffman) {
    return std::unique_ptr<Cryptor>(std::make_unique<HuffmanDecoder>(message));
  }
  if (mode &&
    type == Cryptors::Lz77) {
    return std::unique_ptr<Cryptor>(std::make_unique<Lz77Encoder>(message));
  }
  if (!mode &&
    type == Cryptors::Lz77) {
    return std::unique_ptr<Cryptor>(std::make_unique<Lz77Decoder>(message));

  }
  if (mode &&
    type == Cryptors::Deflate) {
    return std::unique_ptr<Cryptor>(std::make_unique<DeflateEncoder>(message));
  }
  if (!mode &&
    type == Cryptors::Deflate) {
    return std::unique_ptr<Cryptor>(std::make_unique<DeflateDecoder>(message));
  }

  throw runtime_error("Not implemented factory case");
}